

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp.cpp
# Opt level: O2

bool __thiscall libDAI::BP::initProps(BP *this)

{
  Properties *this_00;
  bool bVar1;
  UpdateType UVar2;
  unsigned_long uVar3;
  double dVar4;
  allocator<char> local_39;
  PropertyKey local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"updates",&local_39);
  this_00 = &(this->super_DAIAlgFG).super_InferenceAlgorithm._properties;
  bVar1 = Properties::hasKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"tol",&local_39);
    bVar1 = Properties::hasKey(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"maxiter",&local_39);
      bVar1 = Properties::hasKey(this_00,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"verbose",&local_39);
        bVar1 = Properties::hasKey(this_00,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"updates",&local_39);
          UVar2 = Properties::FromStringTo<libDAI::BP::UpdateType>(this_00,&local_38);
          (this->Props).updates.v = UVar2.v;
          std::__cxx11::string::~string((string *)&local_38);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"tol",&local_39);
          dVar4 = Properties::FromStringTo<double>(this_00,&local_38);
          (this->Props).tol = dVar4;
          std::__cxx11::string::~string((string *)&local_38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"maxiter",&local_39);
          uVar3 = Properties::FromStringTo<unsigned_long>(this_00,&local_38);
          (this->Props).maxiter = uVar3;
          std::__cxx11::string::~string((string *)&local_38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"verbose",&local_39);
          uVar3 = Properties::FromStringTo<unsigned_long>(this_00,&local_38);
          (this->Props).verbose = uVar3;
          std::__cxx11::string::~string((string *)&local_38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"damping",&local_39);
          bVar1 = Properties::hasKey(this_00,&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"damping",&local_39);
            dVar4 = Properties::FromStringTo<double>(this_00,&local_38);
            (this->Props).damping = dVar4;
            std::__cxx11::string::~string((string *)&local_38);
          }
          else {
            (this->Props).damping = 0.0;
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool BP::initProps() {
        if( !HasProperty("updates") )
            return false;
        if( !HasProperty("tol") )
            return false;
        if( !HasProperty("maxiter") )
            return false;
        if( !HasProperty("verbose") )
            return false;
        
        Props.updates = FromStringTo<UpdateType>("updates");
        Props.tol     = FromStringTo<double>("tol");
        Props.maxiter = FromStringTo<size_t>("maxiter");
        Props.verbose = FromStringTo<size_t>("verbose");
        if( HasProperty("damping") )
            Props.damping = FromStringTo<double>("damping");
        else
            Props.damping = 0.0;

        return true;
    }